

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

void Gia_ManMarkWithTravId_rec(Gia_Man_t *p,int Id)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  uint uVar4;
  
  while( true ) {
    iVar1 = Gia_ObjIsTravIdCurrentId(p,Id);
    if (iVar1 != 0) {
      return;
    }
    if (p->nTravIdsAlloc <= Id) break;
    p->pTravIds[Id] = p->nTravIds;
    pGVar2 = Gia_ManObj(p,Id);
    uVar3 = *(ulong *)pGVar2;
    uVar4 = (uint)(uVar3 & 0x1fffffff);
    if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar3) {
      Gia_ManMarkWithTravId_rec(p,Id - ((uint)uVar3 & 0x1fffffff));
      uVar3 = *(ulong *)pGVar2;
      uVar4 = (uint)uVar3 & 0x1fffffff;
    }
    if ((int)uVar3 < 0) {
      return;
    }
    if (uVar4 == 0x1fffffff) {
      return;
    }
    Id = Id - ((uint)(uVar3 >> 0x20) & 0x1fffffff);
  }
  __assert_fail("Id < p->nTravIdsAlloc",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x23e,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManMarkWithTravId_rec( Gia_Man_t * p, int Id )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManMarkWithTravId_rec( p, Gia_ObjFaninId0(pObj, Id) );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManMarkWithTravId_rec( p, Gia_ObjFaninId1(pObj, Id) );
}